

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::str_format_internal::ParsedFormatBase::MatchesConversions
          (ParsedFormatBase *this,bool allow_ignored,
          initializer_list<absl::lts_20240722::FormatConversionCharSet> convs)

{
  pointer pCVar1;
  FormatConversionCharSet FVar2;
  char conv;
  ulong uVar3;
  FormatConversionCharSet FVar4;
  ulong uVar5;
  iterator pFVar6;
  pointer pCVar7;
  byte bVar8;
  undefined7 in_register_00000031;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> used;
  uint local_7c;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78;
  uint local_6c;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  uVar3 = CONCAT71(in_register_00000031,allow_ignored);
  uVar5 = convs._M_len;
  pFVar6 = convs._M_array;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pCVar7 = (this->items_).
           super__Vector_base<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->items_).
           super__Vector_base<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem,_std::allocator<absl::lts_20240722::str_format_internal::ParsedFormatBase::ConversionItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar7 != pCVar1) {
    local_6c = (uint)uVar3;
    do {
      if (pCVar7->is_conversion == true) {
        local_7c = (pCVar7->conv).precision.value_;
        if ((int)local_7c < -1) {
          local_7c = ~local_7c;
          if ((local_7c <= uVar5) && ((pFVar6[(ulong)local_7c - 1] & 1) != 0)) {
            local_78 = &local_68;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,&local_7c,&local_78);
            goto LAB_0010ea70;
          }
        }
        else {
LAB_0010ea70:
          local_7c = (pCVar7->conv).width.value_;
          if ((int)local_7c < -1) {
            local_7c = ~local_7c;
            if ((uVar5 < local_7c) || ((pFVar6[(ulong)local_7c - 1] & 1) == 0)) goto LAB_0010eb0e;
            local_78 = &local_68;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,&local_7c,&local_78);
          }
          uVar3 = (ulong)(pCVar7->conv).conv;
          if (uVar3 < 0x13) {
            conv = "csdiouxXfFeEgGaAnpv"[uVar3];
          }
          else {
            conv = '\0';
          }
          local_7c = (pCVar7->conv).arg_position;
          if (((ulong)(long)(int)local_7c <= uVar5) &&
             (FVar2 = pFVar6[(long)(int)local_7c - 1], FVar4 = FormatConversionCharToConvInt(conv),
             (FVar4 & FVar2) != 0)) {
            local_78 = &local_68;
            std::
            _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                      ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,&local_7c,&local_78);
            goto LAB_0010eaf6;
          }
        }
LAB_0010eb0e:
        bVar8 = 0;
        goto LAB_0010eb1e;
      }
LAB_0010eaf6:
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar1);
    uVar3 = (ulong)local_6c;
  }
  bVar8 = local_68._M_element_count == uVar5 | (byte)uVar3;
LAB_0010eb1e:
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return (bool)bVar8;
}

Assistant:

bool ParsedFormatBase::MatchesConversions(
    bool allow_ignored,
    std::initializer_list<FormatConversionCharSet> convs) const {
  std::unordered_set<int> used;
  auto add_if_valid_conv = [&](int pos, char c) {
    if (static_cast<size_t>(pos) > convs.size() ||
        !Contains(convs.begin()[pos - 1], c))
      return false;
    used.insert(pos);
    return true;
  };
  for (const ConversionItem &item : items_) {
    if (!item.is_conversion) continue;
    auto &conv = item.conv;
    if (conv.precision.is_from_arg() &&
        !add_if_valid_conv(conv.precision.get_from_arg(), '*'))
      return false;
    if (conv.width.is_from_arg() &&
        !add_if_valid_conv(conv.width.get_from_arg(), '*'))
      return false;
    if (!add_if_valid_conv(conv.arg_position,
                           FormatConversionCharToChar(conv.conv)))
      return false;
  }
  return used.size() == convs.size() || allow_ignored;
}